

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_motion::load(xr_motion *this,xr_reader *r)

{
  int32_t iVar1;
  float fVar2;
  xr_reader *r_local;
  xr_motion *this_local;
  
  xr_reader::r_sz(r,&this->m_name);
  iVar1 = xr_reader::r_s32(r);
  this->m_frame_start = iVar1;
  iVar1 = xr_reader::r_s32(r);
  this->m_frame_end = iVar1;
  fVar2 = xr_reader::r_float(r);
  this->m_fps = fVar2;
  return;
}

Assistant:

void xr_motion::load(xr_reader& r)
{
	r.r_sz(m_name);
	m_frame_start = r.r_s32();
	m_frame_end = r.r_s32();
	m_fps = r.r_float();
}